

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::draw(Board *this,RenderTarget *target,RenderStates states)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  RenderStates states_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  repr rVar8;
  pointer ppVar9;
  Chunk *pCVar10;
  Vertex *pVVar11;
  LodRenderer *this_00;
  long in_RDI;
  RenderTarget *target_00;
  float Y;
  float X;
  Vector2f in_stack_00000008;
  Vector2f in_stack_00000010;
  string *in_stack_00000018;
  DebugScreen *in_stack_00000020;
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  undefined8 in_stack_00000058;
  undefined8 in_stack_00000060;
  float fStack0000000000000068;
  float fStack000000000000006c;
  Color borderColor;
  float xChunkPos;
  int x;
  float yChunkPos;
  const_iterator chunkDrawable;
  int y;
  uint i;
  Vector2i positionOffset;
  int chunkWidthTexels;
  RenderStates states2;
  Vector2f *in_stack_fffffffffffffd28;
  Vector2f this_01;
  array<ChunkRender,_5UL> *in_stack_fffffffffffffd30;
  Vector2f this_02;
  string *name;
  DebugScreen *this_03;
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *this_04;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 uVar12;
  Drawable *in_stack_fffffffffffffe08;
  Drawable *drawable;
  RenderTarget *in_stack_fffffffffffffe10;
  RenderTarget *this_05;
  undefined8 in_stack_fffffffffffffe30;
  allocator *paVar13;
  undefined1 in_stack_fffffffffffffe38 [44];
  Vector2f in_stack_fffffffffffffe64;
  Vector2f in_stack_fffffffffffffe6c;
  Vector2f in_stack_fffffffffffffe74;
  Vector2f in_stack_fffffffffffffe7c;
  Color in_stack_fffffffffffffe84;
  Color CVar14;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  Color CVar15;
  undefined4 in_stack_fffffffffffffe94;
  int local_168;
  __normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
  local_158;
  int local_150;
  int local_14c;
  Vector2<int> local_148;
  undefined4 local_140;
  allocator local_129;
  string local_128 [32];
  Vector2f local_108;
  Vector2f VStack_100;
  string *local_f8;
  DebugScreen *pDStack_f0;
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *local_e8;
  float afStack_e0 [2];
  float local_d8 [2];
  float afStack_d0 [2];
  float local_c8 [2];
  float afStack_c0 [2];
  float local_b8 [2];
  float afStack_b0 [6];
  Vector2<int> local_98;
  Vector2<int> local_90;
  Vector2<int> local_88;
  undefined1 local_80 [32];
  Drawable DStack_60;
  FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *local_58;
  float afStack_50 [2];
  float local_48 [2];
  float afStack_40 [2];
  float local_38 [2];
  float afStack_30 [2];
  float local_28 [2];
  float afStack_20 [8];
  
  target_00 = (RenderTarget *)(in_RDI + 8);
  LodRenderer::getLevelOfDetail((LodRenderer *)target_00);
  std::array<ChunkRender,_5UL>::operator[]
            (in_stack_fffffffffffffd30,(size_type)in_stack_fffffffffffffd28);
  sf::RenderTarget::draw
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (RenderStates *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  afStack_20[2] = fStack0000000000000068;
  afStack_20[3] = fStack000000000000006c;
  local_28 = (float  [2])in_stack_00000058;
  afStack_20._0_8_ = in_stack_00000060;
  local_38 = (float  [2])in_stack_00000048;
  afStack_30 = (float  [2])in_stack_00000050;
  local_80._8_8_ = in_stack_00000008;
  local_80._16_8_ = in_stack_00000010;
  local_80._24_8_ = in_stack_00000018;
  DStack_60._vptr_Drawable = (_func_int **)in_stack_00000020;
  local_58 = in_stack_00000028;
  afStack_50 = (float  [2])in_stack_00000030;
  local_48 = (float  [2])in_stack_00000038;
  afStack_40 = (float  [2])in_stack_00000040;
  drawable = &DStack_60;
  this_00 = (LodRenderer *)(in_RDI + 0x1118);
  iVar1 = *(int *)(in_RDI + 0x1118);
  iVar6 = ChunkCoords::x((repr)in_stack_fffffffffffffd30);
  iVar2 = *(int *)(in_RDI + 0x111c);
  iVar7 = ChunkCoords::y((repr)in_stack_fffffffffffffd30);
  sf::Vector2<int>::Vector2(&local_98,iVar1 - iVar6,iVar2 - iVar7);
  uVar12 = 0x20;
  local_90 = sf::operator*((Vector2<int> *)in_stack_fffffffffffffd28,0);
  local_88 = sf::operator*((Vector2<int> *)in_stack_fffffffffffffd28,0);
  this_05 = (RenderTarget *)local_80;
  sf::Vector2<float>::Vector2<int>((Vector2<float> *)this_05,&local_88);
  sf::Transform::translate((Transform *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  afStack_b0[2] = afStack_20[2];
  afStack_b0[3] = afStack_20[3];
  local_b8[0] = local_28[0];
  local_b8[1] = local_28[1];
  afStack_b0[0] = afStack_20[0];
  afStack_b0[1] = afStack_20[1];
  local_c8[0] = local_38[0];
  local_c8[1] = local_38[1];
  afStack_c0[0] = afStack_30[0];
  afStack_c0[1] = afStack_30[1];
  local_d8[0] = local_48[0];
  local_d8[1] = local_48[1];
  afStack_d0[0] = afStack_40[0];
  afStack_d0[1] = afStack_40[1];
  local_e8 = local_58;
  afStack_e0[0] = afStack_50[0];
  afStack_e0[1] = afStack_50[1];
  local_f8 = (string *)local_80._24_8_;
  pDStack_f0 = (DebugScreen *)DStack_60._vptr_Drawable;
  local_108.x = (float)local_80._8_4_;
  local_108.y = (float)local_80._12_4_;
  VStack_100.x = (float)local_80._16_4_;
  VStack_100.y = (float)local_80._20_4_;
  states_00.blendMode.colorEquation = in_stack_fffffffffffffe38._0_4_;
  states_00.blendMode.alphaSrcFactor = in_stack_fffffffffffffe38._4_4_;
  states_00.blendMode.alphaDstFactor = in_stack_fffffffffffffe38._8_4_;
  states_00.blendMode.alphaEquation = in_stack_fffffffffffffe38._12_4_;
  states_00.transform.m_matrix[0] = (float)in_stack_fffffffffffffe38._16_4_;
  states_00.transform.m_matrix[1] = (float)in_stack_fffffffffffffe38._20_4_;
  states_00.transform.m_matrix[2] = (float)in_stack_fffffffffffffe38._24_4_;
  states_00.transform.m_matrix[3] = (float)in_stack_fffffffffffffe38._28_4_;
  states_00.transform.m_matrix[4] = (float)in_stack_fffffffffffffe38._32_4_;
  states_00.transform.m_matrix[5] = (float)in_stack_fffffffffffffe38._36_4_;
  states_00.transform.m_matrix[6] = (float)in_stack_fffffffffffffe38._40_4_;
  states_00.blendMode.colorSrcFactor = (int)in_stack_fffffffffffffe30;
  states_00.blendMode.colorDstFactor = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  states_00.transform.m_matrix[7] = in_stack_fffffffffffffe64.x;
  states_00.transform.m_matrix[8] = in_stack_fffffffffffffe64.y;
  states_00.transform.m_matrix[9] = in_stack_fffffffffffffe6c.x;
  states_00.transform.m_matrix[10] = in_stack_fffffffffffffe6c.y;
  states_00.transform.m_matrix[0xb] = in_stack_fffffffffffffe74.x;
  states_00.transform.m_matrix[0xc] = in_stack_fffffffffffffe74.y;
  states_00.transform.m_matrix[0xd] = in_stack_fffffffffffffe7c.x;
  states_00.transform.m_matrix[0xe] = in_stack_fffffffffffffe7c.y;
  states_00.transform.m_matrix[0xf] = (float)in_stack_fffffffffffffe84;
  states_00.texture = (Texture *)in_stack_fffffffffffffe88;
  states_00.shader._0_4_ = in_stack_fffffffffffffe90;
  states_00.shader._4_4_ = in_stack_fffffffffffffe94;
  LodRenderer::drawDecorations(this_00,target_00,states_00,(ChunkCoordsRange *)this_05);
  DebugScreen::instance();
  paVar13 = &local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"Board::draw draw_debug",paVar13);
  DebugScreen::profilerEvent((DebugScreen *)DStack_60._vptr_Drawable,(string *)local_80._24_8_);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  name = (string *)local_80._24_8_;
  this_03 = (DebugScreen *)DStack_60._vptr_Drawable;
  if ((((*(byte *)(in_RDI + 0x1158) & 1) != 0) && (0 < *(int *)(in_RDI + 0x1120))) &&
     (0 < *(int *)(in_RDI + 0x1124))) {
    sf::VertexArray::resize((VertexArray *)local_80._16_8_,local_80._8_8_);
    local_140 = 0x400;
    iVar1 = *(int *)(in_RDI + 0x1118);
    iVar6 = ChunkCoords::x(local_80._16_8_);
    iVar2 = *(int *)(in_RDI + 0x111c);
    iVar7 = ChunkCoords::y(local_80._16_8_);
    sf::Vector2<int>::Vector2(&local_148,iVar1 - iVar6,iVar2 - iVar7);
    local_14c = 0;
    this_01 = (Vector2f)local_80._8_8_;
    this_02 = (Vector2f)local_80._16_8_;
    name = (string *)local_80._24_8_;
    this_03 = (DebugScreen *)DStack_60._vptr_Drawable;
    this_04 = local_58;
    for (local_150 = 0; local_150 < *(int *)(in_RDI + 0x1124); local_150 = local_150 + 1) {
      ChunkCoords::pack((int)this_02.y,(int)this_02.x);
      local_158._M_current =
           (pair<unsigned_long,_ChunkDrawable> *)
           FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::upper_bound
                     (this_04,(unsigned_long *)this_03);
      Y = (float)((local_150 + local_148.y) * 0x400);
      for (local_168 = 0; local_168 < *(int *)(in_RDI + 0x1120); local_168 = local_168 + 1) {
        X = (float)((local_168 + local_148.x) * 0x400);
        CVar15 = sf::Color::Blue;
        FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::end
                  ((FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *)this_01);
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                            *)this_02,
                           (__normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                            *)this_01);
        bVar5 = false;
        if (bVar4) {
          ppVar9 = __gnu_cxx::
                   __normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                   ::operator->(&local_158);
          uVar3 = ppVar9->first;
          rVar8 = ChunkCoords::pack((int)this_02.y,(int)this_02.x);
          bVar5 = uVar3 == rVar8;
        }
        if (bVar5) {
          ppVar9 = __gnu_cxx::
                   __normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                   ::operator->(&local_158);
          pCVar10 = ChunkDrawable::getChunk(&ppVar9->second);
          CVar14 = in_stack_fffffffffffffe84;
          CVar15 = sf::Color::Cyan;
          if (pCVar10 != (Chunk *)0x0) {
            ppVar9 = __gnu_cxx::
                     __normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
                     ::operator->(&local_158);
            ChunkDrawable::getChunk(&ppVar9->second);
            bVar5 = Chunk::isUnsaved((Chunk *)0x163637);
            CVar14 = sf::Color::Yellow;
            CVar15 = sf::Color::Yellow;
            if (bVar5) {
              sf::Color::Color((Color *)&stack0xfffffffffffffe84,0xff,'\x7f','\0',0xff);
              CVar14 = in_stack_fffffffffffffe84;
              CVar15 = in_stack_fffffffffffffe84;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_long,_ChunkDrawable>_*,_std::vector<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>_>
          ::operator++(&local_158);
          in_stack_fffffffffffffe84 = CVar14;
        }
        sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xfffffffffffffe7c,X,Y);
        pVVar11 = sf::VertexArray::operator[]((VertexArray *)this_02,(size_t)this_01);
        pVVar11->position = in_stack_fffffffffffffe7c;
        pVVar11 = sf::VertexArray::operator[]((VertexArray *)this_02,(size_t)this_01);
        pVVar11->color = CVar15;
        sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xfffffffffffffe74,X + 1024.0,Y);
        pVVar11 = sf::VertexArray::operator[]((VertexArray *)this_02,(size_t)this_01);
        pVVar11->position = in_stack_fffffffffffffe74;
        pVVar11 = sf::VertexArray::operator[]((VertexArray *)this_02,(size_t)this_01);
        pVVar11->color = CVar15;
        sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xfffffffffffffe6c,X,Y);
        pVVar11 = sf::VertexArray::operator[]((VertexArray *)this_02,(size_t)this_01);
        pVVar11->position = in_stack_fffffffffffffe6c;
        pVVar11 = sf::VertexArray::operator[]((VertexArray *)this_02,(size_t)this_01);
        pVVar11->color = CVar15;
        sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xfffffffffffffe64,X,Y + 1024.0);
        pVVar11 = sf::VertexArray::operator[]((VertexArray *)this_02,(size_t)this_01);
        pVVar11->position = in_stack_fffffffffffffe64;
        pVVar11 = sf::VertexArray::operator[]((VertexArray *)this_02,(size_t)this_01);
        pVVar11->color = CVar15;
        local_14c = local_14c + 4;
      }
    }
    sf::RenderTarget::draw
              (this_05,drawable,(RenderStates *)CONCAT44(uVar12,in_stack_fffffffffffffe00));
  }
  DebugScreen::instance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe40,"Board::draw draw_debug_done",
             (allocator *)&stack0xfffffffffffffe3f);
  DebugScreen::profilerEvent(this_03,name);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe3f);
  return;
}

Assistant:

void Board::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    target.draw(chunkRenderCache_[getLevelOfDetail()], states);

    sf::RenderStates states2 = states;
    states2.transform.translate(static_cast<sf::Vector2f>(
        sf::Vector2i(
            lastVisibleArea_.left - ChunkCoords::x(lastTopLeft_),
            lastVisibleArea_.top - ChunkCoords::y(lastTopLeft_)
        ) * Chunk::WIDTH * static_cast<int>(TileWidth::TEXELS)
    ));
    drawDecorations(target, states2, lastVisibleArea_);

    DebugScreen::instance()->profilerEvent("Board::draw draw_debug");
    if (debugDrawChunkBorder_ && lastVisibleArea_.width > 0 && lastVisibleArea_.height > 0) {
        debugChunkBorder_.resize(lastVisibleArea_.width * lastVisibleArea_.height * 4);
        constexpr int chunkWidthTexels = Chunk::WIDTH * static_cast<int>(TileWidth::TEXELS);
        const sf::Vector2i positionOffset = {
            lastVisibleArea_.left - ChunkCoords::x(lastTopLeft_),
            lastVisibleArea_.top - ChunkCoords::y(lastTopLeft_)
        };

        unsigned int i = 0;
        for (int y = 0; y < lastVisibleArea_.height; ++y) {
            auto chunkDrawable = chunkDrawables_.upper_bound(ChunkCoords::pack(lastVisibleArea_.left - 1, lastVisibleArea_.top + y));
            float yChunkPos = static_cast<float>((y + positionOffset.y) * chunkWidthTexels);
            for (int x = 0; x < lastVisibleArea_.width; ++x) {
                float xChunkPos = static_cast<float>((x + positionOffset.x) * chunkWidthTexels);
                sf::Color borderColor = sf::Color::Blue;
                if (chunkDrawable != chunkDrawables_.end() && chunkDrawable->first == ChunkCoords::pack(lastVisibleArea_.left + x, lastVisibleArea_.top + y)) {
                    if (chunkDrawable->second.getChunk() != nullptr) {
                        borderColor = (chunkDrawable->second.getChunk()->isUnsaved() ? sf::Color(255, 127, 0) : sf::Color::Yellow);
                    } else {
                        borderColor = sf::Color::Cyan;
                    }
                    ++chunkDrawable;
                }

                debugChunkBorder_[i + 0].position = {xChunkPos, yChunkPos};
                debugChunkBorder_[i + 0].color = borderColor;
                debugChunkBorder_[i + 1].position = {xChunkPos + chunkWidthTexels, yChunkPos};
                debugChunkBorder_[i + 1].color = borderColor;
                debugChunkBorder_[i + 2].position = {xChunkPos, yChunkPos};
                debugChunkBorder_[i + 2].color = borderColor;
                debugChunkBorder_[i + 3].position = {xChunkPos, yChunkPos + chunkWidthTexels};
                debugChunkBorder_[i + 3].color = borderColor;
                i += 4;
            }
        }
        target.draw(debugChunkBorder_, states);
    }
    DebugScreen::instance()->profilerEvent("Board::draw draw_debug_done");
}